

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O3

uchar rule_p2_p3(BidiType *types,size_t size)

{
  BidiType BVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (size != 0) {
    sVar4 = 0;
    do {
      BVar1 = types[sVar4];
      if ((0x908U >> (BVar1 & (CS|AN)) & 1) == 0) {
        if ((1 << ((byte)BVar1 & 0x1f) & 0x31U) != 0) {
          return BVar1 != L;
        }
      }
      else {
        uVar3 = sVar4 + 1;
        sVar4 = size;
        if (uVar3 < size) {
          iVar2 = 1;
          do {
            if ((0x908U >> (types[uVar3] & (CS|AN)) & 1) == 0) {
              if ((types[uVar3] == PDI) && (iVar2 = iVar2 + -1, sVar4 = uVar3, iVar2 == 0)) break;
            }
            else {
              iVar2 = iVar2 + 1;
            }
            uVar3 = uVar3 + 1;
            sVar4 = size;
          } while (size != uVar3);
        }
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 < size);
  }
  return '\0';
}

Assistant:

static unsigned char rule_p2_p3(const BidiType *types, size_t size)
{
    /*
     * Rule P2. Find the first strong type (L, R or AL), ignoring
     * anything inside an isolated segment.
     *
     * Rule P3. If that type is R or AL, choose a paragraph embeddding
     * level of 1, otherwise 0.
     */
    for (size_t i = 0; i < size; i++) {
        BidiType t = types[i];
        if (typeIsIsolateInitiator(t))
            i = find_matching_pdi(types, i, size);
        else if (typeIsStrong(t))
            return (t == L ? 0 : 1);
    }

    return 0; /* default if no strong type found */
}